

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O1

bool SparseKeyTest<2048,Blob<160>>
               (hashfunc<Blob<160>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  int iVar3;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> hashes;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> local_158;
  undefined1 local_138 [128];
  undefined1 local_b8 [64];
  undefined1 local_78 [64];
  
  pcVar2 = "exactly";
  iVar3 = (int)CONCAT71(in_register_00000011,inclusive);
  if (iVar3 != 0) {
    pcVar2 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x800,pcVar2,(ulong)(uint)setbits)
  ;
  local_158.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138._0_64_ = ZEXT464(0) << 0x40;
  local_138._64_64_ = local_138._0_64_;
  local_b8 = local_138._0_64_;
  local_78 = local_138._0_64_;
  if (iVar3 != 0) {
    std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::resize(&local_158,1);
    (*hash.m_hash)(local_138,0x100,0,
                   local_158.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
                   super__Vector_impl_data._M_start);
  }
  SparseKeygenRecurse<Blob<2048>,Blob<160>>
            (hash.m_hash,0,setbits,inclusive,(Blob<2048> *)local_138,&local_158);
  printf("%d keys\n",
         (ulong)(uint)((int)((ulong)((long)local_158.
                                           super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_158.
                                          super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                      -0x33333333));
  bVar1 = TestHashList<Blob<160>>(&local_158,drawDiagram,testColl,testDist,true,true);
  putchar(10);
  if (local_158.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive,
                     bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits,
         inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashes.resize(1);
    hash(&k,sizeof(keytype),0,&hashes[0]);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}